

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O0

bool __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::insert(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
         *this,value_type *value)

{
  unsigned_long_long uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pair<unsigned_long_long,_int> y_00;
  pair<unsigned_long_long,_int> x_00;
  bool bVar4;
  ulong uVar6;
  undefined8 *__s;
  void *wz;
  void *pvVar7;
  undefined8 uVar8;
  pair<unsigned_long_long,_int> *key;
  undefined8 *puVar9;
  long lVar10;
  unsigned_long_long *in_RSI;
  int *in_RDI;
  undefined1 auVar11 [16];
  node *y;
  pair<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node_*,_long>
  lnk_1;
  pair<unsigned_long_long,_int> tmpk [100];
  long tmpv [100];
  node **x;
  int *pp;
  node **p;
  locType *pos;
  node *x_1;
  pair<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node_*,_long>
  lnk;
  int j;
  int i;
  long vt;
  pair<unsigned_long_long,_int> vkey;
  pair<unsigned_long_long,_int> *in_stack_fffffffffffff588;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *in_stack_fffffffffffff590;
  unsigned_long_long in_stack_fffffffffffff598;
  undefined8 in_stack_fffffffffffff5a0;
  unsigned_long_long in_stack_fffffffffffff5a8;
  undefined8 in_stack_fffffffffffff5b0;
  pair<unsigned_long_long,_int> *ppVar12;
  pair<unsigned_long_long,_int> *local_a48;
  byte local_a23;
  byte local_a22;
  bool local_a21;
  undefined8 local_a00;
  pair<unsigned_long_long,_int> local_9f8 [100];
  pair<unsigned_long_long,_int> apStack_3b8 [50];
  locType *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  node **in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *in_stack_ffffffffffffff90;
  int local_38;
  int local_34;
  pair<unsigned_long_long,_int> local_28 [2];
  bool local_1;
  unsigned_long_long *puVar5;
  
  local_28[0].first = *in_RSI;
  local_28[0]._8_8_ = in_RSI[1];
  uVar1 = in_RSI[2];
  if (*in_RDI == 0) {
    auVar11 = (**(code **)(**(long **)(in_RDI + 4) + 8))();
    puVar5 = auVar11._0_8_;
    *(long *)(in_RDI + 2) = auVar11._8_8_;
    *in_RDI = 1;
    *(undefined4 *)(puVar5 + 299) = 1;
    std::pair<unsigned_long_long,_int>::operator=
              ((pair<unsigned_long_long,_int> *)(puVar5 + 0x65),local_28);
    *puVar5 = uVar1;
    puVar5[100] = 0xffffffffffffffff;
    (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),in_RDI + 2);
    in_RDI[1] = 1;
    local_1 = true;
  }
  else {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (long)*in_RDI;
    uVar6 = SUB168(auVar11 * ZEXT816(8),0);
    if (SUB168(auVar11 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    __s = (undefined8 *)operator_new__(uVar6);
    memset(__s,0,8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)*in_RDI;
    uVar6 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    wz = operator_new__(uVar6);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)*in_RDI;
    uVar6 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pvVar7 = operator_new__(uVar6);
    *__s = *(undefined8 *)(in_RDI + 2);
    for (local_34 = 0; local_34 < *in_RDI; local_34 = local_34 + 1) {
      uVar8 = (**(code **)(**(long **)(in_RDI + 4) + 0x10))(*(long **)(in_RDI + 4),__s + local_34);
      *(undefined8 *)((long)wz + (long)local_34 * 8) = uVar8;
      local_38 = 0;
      while( true ) {
        local_a21 = false;
        if (local_38 < *(int *)(*(long *)((long)wz + (long)local_34 * 8) + 0x958)) {
          local_a21 = std::less<std::pair<unsigned_long_long,_int>_>::operator()
                                ((less<std::pair<unsigned_long_long,_int>_> *)
                                 in_stack_fffffffffffff590,in_stack_fffffffffffff588,
                                 (pair<unsigned_long_long,_int> *)0x11b5f9);
        }
        if (local_a21 == false) break;
        local_38 = local_38 + 1;
      }
      if (local_34 < *in_RDI + -1) {
        local_a22 = 0;
        if (local_38 < *(int *)(*(long *)((long)wz + (long)local_34 * 8) + 0x958)) {
          bVar4 = std::less<std::pair<unsigned_long_long,_int>_>::operator()
                            ((less<std::pair<unsigned_long_long,_int>_> *)in_stack_fffffffffffff590,
                             in_stack_fffffffffffff588,(pair<unsigned_long_long,_int> *)0x11b6a0);
          local_a22 = bVar4 ^ 0xff;
        }
        if ((local_a22 & 1) != 0) {
          local_38 = local_38 + 1;
        }
        __s[local_34 + 1] =
             *(undefined8 *)(*(long *)((long)wz + (long)local_34 * 8) + (long)local_38 * 8);
      }
      *(int *)((long)pvVar7 + (long)local_34 * 4) = local_38;
    }
    local_a23 = 0;
    if (local_38 < *(int *)(*(long *)((long)wz + (long)(*in_RDI + -1) * 8) + 0x958)) {
      bVar4 = std::less<std::pair<unsigned_long_long,_int>_>::operator()
                        ((less<std::pair<unsigned_long_long,_int>_> *)in_stack_fffffffffffff590,
                         in_stack_fffffffffffff588,(pair<unsigned_long_long,_int> *)0x11b79c);
      local_a23 = bVar4 ^ 0xff;
    }
    if ((local_a23 & 1) == 0) {
      key = (pair<unsigned_long_long,_int> *)((long)wz + (long)(*in_RDI + -1) * 8);
      if (local_38 == 0) {
        for (local_34 = *in_RDI + -2; -1 < local_34; local_34 = local_34 + -1) {
          if (*(int *)((long)pvVar7 + (long)local_34 * 4) != 0) {
            in_stack_ffffffffffffff78 = *(node ***)(key->first + 0x328);
            in_stack_ffffffffffffff80 = *(int **)(key->first + 0x330);
            puVar9 = (undefined8 *)
                     (*(long *)((long)wz + (long)local_34 * 8) + 0x328 +
                     (long)(*(int *)((long)pvVar7 + (long)local_34 * 4) + -1) * 0x10);
            in_stack_ffffffffffffff68 = (locType *)*puVar9;
            in_stack_ffffffffffffff70 = (int *)puVar9[1];
            x_00._8_8_ = in_stack_fffffffffffff5b0;
            x_00.first = in_stack_fffffffffffff5a8;
            y_00._8_8_ = in_stack_fffffffffffff5a0;
            y_00.first = in_stack_fffffffffffff598;
            bVar4 = equal(in_stack_fffffffffffff590,x_00,y_00);
            if (bVar4) {
              std::pair<unsigned_long_long,_int>::operator=
                        ((pair<unsigned_long_long,_int> *)
                         (*(long *)((long)wz + (long)local_34 * 8) + 0x328 +
                         (long)(*(int *)((long)pvVar7 + (long)local_34 * 4) + -1) * 0x10),local_28);
              (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),__s + local_34);
              break;
            }
          }
        }
      }
      if (*(int *)(key->first + 0x958) < 99) {
        for (local_34 = *(int *)(key->first + 0x958); local_38 < local_34; local_34 = local_34 + -1)
        {
          std::pair<unsigned_long_long,_int>::operator=
                    ((pair<unsigned_long_long,_int> *)(key->first + 0x328 + (long)local_34 * 0x10),
                     (type)(key->first + 0x328 + (long)(local_34 + -1) * 0x10));
          *(undefined8 *)(key->first + (long)local_34 * 8) =
               *(undefined8 *)(key->first + (long)(local_34 + -1) * 8);
        }
        std::pair<unsigned_long_long,_int>::operator=
                  ((pair<unsigned_long_long,_int> *)(key->first + 0x328 + (long)local_38 * 0x10),
                   local_28);
        *(unsigned_long_long *)(key->first + (long)local_38 * 8) = uVar1;
        *(int *)(key->first + 0x958) = *(int *)(key->first + 0x958) + 1;
        (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),__s + (*in_RDI + -1));
      }
      else {
        local_a48 = local_9f8;
        ppVar12 = apStack_3b8;
        do {
          std::pair<unsigned_long_long,_int>::pair<unsigned_long_long,_int,_true>(local_a48);
          local_a48 = local_a48 + 1;
        } while (local_a48 != ppVar12);
        auVar11 = (**(code **)(**(long **)(in_RDI + 4) + 8))();
        local_a00 = auVar11._8_8_;
        lVar10 = auVar11._0_8_;
        for (local_34 = 0; local_34 < local_38; local_34 = local_34 + 1) {
          (&apStack_3b8[0].first)[local_34] =
               *(unsigned_long_long *)(key->first + (long)local_34 * 8);
          std::pair<unsigned_long_long,_int>::operator=
                    (local_9f8 + local_34,(type)(key->first + 0x328 + (long)local_34 * 0x10));
        }
        (&apStack_3b8[0].first)[local_38] = uVar1;
        std::pair<unsigned_long_long,_int>::operator=(local_9f8 + local_38,local_28);
        while (local_34 = local_38 + 1, local_34 < 100) {
          (&apStack_3b8[0].first)[local_34] =
               *(unsigned_long_long *)(key->first + (long)local_38 * 8);
          std::pair<unsigned_long_long,_int>::operator=
                    (local_9f8 + local_34,(type)(key->first + 0x328 + (long)local_38 * 0x10));
          local_38 = local_34;
        }
        *(undefined8 *)(lVar10 + 800) = *(undefined8 *)(key->first + 800);
        *(undefined4 *)(key->first + 0x958) = 0x32;
        for (local_34 = 0; local_34 < *(int *)(key->first + 0x958); local_34 = local_34 + 1) {
          *(unsigned_long_long *)(key->first + (long)local_34 * 8) =
               (&apStack_3b8[0].first)[local_34];
          std::pair<unsigned_long_long,_int>::operator=
                    ((pair<unsigned_long_long,_int> *)(key->first + 0x328 + (long)local_34 * 0x10),
                     local_9f8 + local_34);
        }
        *(undefined8 *)(key->first + 800) = local_a00;
        for (local_34 = *(int *)(key->first + 0x958); local_34 < 100; local_34 = local_34 + 1) {
          *(unsigned_long_long *)(lVar10 + (long)(local_34 - *(int *)(key->first + 0x958)) * 8) =
               (&apStack_3b8[0].first)[local_34];
          std::pair<unsigned_long_long,_int>::operator=
                    ((pair<unsigned_long_long,_int> *)
                     (lVar10 + 0x328 + (long)(local_34 - *(int *)(key->first + 0x958)) * 0x10),
                     local_9f8 + local_34);
        }
        *(int *)(lVar10 + 0x958) = 100 - *(int *)(key->first + 0x958);
        (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),&local_a00);
        (**(code **)(**(long **)(in_RDI + 4) + 0x18))(*(long **)(in_RDI + 4),__s + (*in_RDI + -1));
        insertnonleaf(in_stack_ffffffffffffff90,key,in_stack_ffffffffffffff80,
                      in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                      (locType)wz);
      }
      if (wz != (void *)0x0) {
        operator_delete__(wz);
      }
      if (pvVar7 != (void *)0x0) {
        operator_delete__(pvVar7);
      }
      if (__s != (undefined8 *)0x0) {
        operator_delete__(__s);
      }
      in_RDI[1] = in_RDI[1] + 1;
      local_1 = true;
    }
    else {
      if (wz != (void *)0x0) {
        operator_delete__(wz);
      }
      if (pvVar7 != (void *)0x0) {
        operator_delete__(pvVar7);
      }
      if (__s != (undefined8 *)0x0) {
        operator_delete__(__s);
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool insert(const value_type &value) {
            Key vkey = value.first;
            T vt = value.second;
            int i, j;
            if (!depth) {
                auto lnk = file->newspace();
                node *x = lnk.first;
                root = lnk.second;
                depth = 1;
                x->sz = 1;
                x->keyvalue[0] = vkey;
                x->val[0] = vt;
                x->nxt = -1;
                file->save(root);
                siz=1;
                return 1;
            }
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth];
            memset(pos, 0, sizeof pos);
            p = new node *[depth];
            pp = new int[depth];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], vkey); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(vkey, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j < p[depth - 1]->sz && !Compare()(vkey, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = vkey;
                        file->save(pos[i]);
                        break;
                    }
            }
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->val[i] = x->val[i - 1];
                x->keyvalue[j] = vkey;
                x->val[j] = vt;
                ++x->sz;
                file->save(pos[depth - 1]);
            } else {
                T tmpv[degree];
                Key tmpk[degree];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = 0; i < j; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                tmpv[j] = vt;
                tmpk[j] = vkey;
                for (i = j + 1; i < degree; ++i)tmpv[i] = x->val[i - 1], tmpk[i] = x->keyvalue[i - 1];
                y->nxt = x->nxt;
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                x->nxt = lnk.second;
                for (i = x->sz; i < degree; ++i)y->val[i - x->sz] = tmpv[i], y->keyvalue[i - x->sz] = tmpk[i];
                y->sz = degree - x->sz;
                file->save(lnk.second);
                file->save(pos[depth - 1]);
                insertnonleaf(y->keyvalue[0], depth - 2, p, pp, pos, lnk.second);
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            ++siz;
            return 1;
        }